

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common_types.cc
# Opt level: O3

void __thiscall webrtc::RTPHeader::RTPHeader(RTPHeader *this)

{
  (this->extension).transmissionTimeOffset = 0;
  (this->extension).hasAbsoluteSendTime = false;
  (this->extension).absoluteSendTime = 0;
  (this->extension).hasTransportSequenceNumber = false;
  (this->extension).transportSequenceNumber = 0;
  (this->extension).hasAudioLevel = false;
  (this->extension).voiceActivity = false;
  (this->extension).voiceActivity = false;
  (this->extension).audioLevel = '\0';
  (this->extension).hasVideoRotation = false;
  (this->extension).videoRotation = '\0';
  this->arrOfCSRCs[0] = 0;
  this->arrOfCSRCs[1] = 0;
  this->arrOfCSRCs[2] = 0;
  this->arrOfCSRCs[3] = 0;
  this->arrOfCSRCs[4] = 0;
  this->arrOfCSRCs[5] = 0;
  this->arrOfCSRCs[6] = 0;
  this->arrOfCSRCs[7] = 0;
  this->arrOfCSRCs[8] = 0;
  this->arrOfCSRCs[9] = 0;
  this->arrOfCSRCs[10] = 0;
  this->arrOfCSRCs[0xb] = 0;
  this->arrOfCSRCs[0xb] = 0;
  this->arrOfCSRCs[0xc] = 0;
  this->arrOfCSRCs[0xd] = 0;
  this->arrOfCSRCs[0xe] = 0;
  this->markerBit = false;
  this->payloadType = '\0';
  this->sequenceNumber = 0;
  this->timestamp = 0;
  *(undefined8 *)((long)&this->timestamp + 1) = 0;
  this->paddingLength = 0;
  this->headerLength = 0;
  *(undefined8 *)((long)&this->headerLength + 5) = 0;
  return;
}

Assistant:

RTPHeader::RTPHeader()
    : markerBit(false),
      payloadType(0),
      sequenceNumber(0),
      timestamp(0),
      ssrc(0),
      numCSRCs(0),
      paddingLength(0),
      headerLength(0),
      payload_type_frequency(0),
      extension() {
  memset(&arrOfCSRCs, 0, sizeof(arrOfCSRCs));
}